

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LToken.cpp
# Opt level: O1

string * __thiscall LToken::str_abi_cxx11_(string *__return_storage_ptr__,LToken *this)

{
  long lVar1;
  char *pcVar2;
  stringstream ss;
  stringstream local_1a0 [16];
  ostream local_190 [112];
  ios_base local_120 [264];
  
  std::__cxx11::stringstream::stringstream(local_1a0);
  switch(this->type) {
  case ADD:
    lVar1 = 3;
    pcVar2 = "ADD";
    break;
  case BR:
    lVar1 = 2;
    pcVar2 = "BR";
    break;
  case BRAC:
    lVar1 = 4;
    pcVar2 = "BRAC";
    break;
  default:
    lVar1 = 7;
    pcVar2 = "INVALID";
    break;
  case ELSE:
    lVar1 = 4;
    pcVar2 = "ELSE";
    break;
  case END:
    lVar1 = 3;
    pcVar2 = "END";
    break;
  case EOFF:
    lVar1 = 4;
    pcVar2 = "EOFF";
    break;
  case EQ:
    lVar1 = 2;
    pcVar2 = "EQ";
    break;
  case EQUAL:
    lVar1 = 5;
    pcVar2 = "EQUAL";
    break;
  case FUNCTION:
    lVar1 = 8;
    pcVar2 = "FUNCTION";
    break;
  case G:
    lVar1 = 1;
    pcVar2 = "G";
    break;
  case GEQ:
    lVar1 = 3;
    pcVar2 = "GEQ";
    break;
  case IF:
    lVar1 = 2;
    pcVar2 = "IF";
    break;
  case INT:
    pcVar2 = "INT: ";
    goto LAB_00112c23;
  case KET:
    lVar1 = 3;
    pcVar2 = "KET";
    break;
  case L:
    lVar1 = 1;
    pcVar2 = "L";
    break;
  case LEQ:
    lVar1 = 3;
    pcVar2 = "LEQ";
    break;
  case NEQ:
    lVar1 = 3;
    pcVar2 = "NEQ";
    break;
  case SUB:
    lVar1 = 3;
    pcVar2 = "SUB";
    break;
  case THEN:
    lVar1 = 4;
    pcVar2 = "THEN";
    break;
  case VAR:
    pcVar2 = "VAR: ";
LAB_00112c23:
    std::__ostream_insert<char,std::char_traits<char>>(local_190,pcVar2,5);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_190,(this->token)._M_dataplus._M_p,(this->token)._M_string_length);
    goto LAB_00112d2c;
  }
  std::__ostream_insert<char,std::char_traits<char>>(local_190,pcVar2,lVar1);
LAB_00112d2c:
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  std::ios_base::~ios_base(local_120);
  return __return_storage_ptr__;
}

Assistant:

std::string LToken::str() {
    std::stringstream ss;
    switch (this->type) {
        case LNodeType::INT:
            ss << "INT: " << this->token;
            break;
        case LNodeType::VAR:
            ss << "VAR: " << this->token;
            break;
        case LNodeType::EQUAL:
            ss << "EQUAL";
            break;
        case LNodeType::L:
            ss << "L";
            break;
        case LNodeType::G:
            ss << "G";
            break;
        case LNodeType::BRAC:
            ss << "BRAC";
            break;
        case LNodeType::KET:
            ss << "KET";
            break;
        case LNodeType::BR:
            ss << "BR";
            break;
        case LNodeType::ADD:
            ss << "ADD";
            break;
        case LNodeType::SUB:
            ss << "SUB";
            break;
        case LNodeType::EQ:
            ss << "EQ";
            break;
        case LNodeType::NEQ:
            ss << "NEQ";
            break;
        case LNodeType::LEQ:
            ss << "LEQ";
            break;
        case LNodeType::GEQ:
            ss << "GEQ";
            break;
        case LNodeType::FUNCTION:
            ss << "FUNCTION";
            break;
        case LNodeType::IF:
            ss << "IF";
            break;
        case LNodeType::THEN:
            ss << "THEN";
            break;
        case LNodeType::ELSE:
            ss << "ELSE";
            break;
        case LNodeType::END:
            ss << "END";
            break;
        case LNodeType::EOFF:
            ss << "EOFF";
            break;
        default:
            ss << "INVALID";
            break;
    }
    return ss.str();
}